

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int socket_wait(int fd,int is_read)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  int ret;
  timeval tv;
  fd_set *fdw;
  fd_set *fdr;
  fd_set fds;
  int is_read_local;
  int fd_local;
  
  fds.__fds_bits[0xf]._4_4_ = fd;
  fds.__fds_bits[0xf]._0_4_ = is_read;
  fdw = (fd_set *)0x0;
  tv.tv_usec = 0;
  ___i = 5;
  tv.tv_sec = 0;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    fds.__fds_bits[(ulong)(uint)__arr - 1] = 0;
  }
  fds.__fds_bits[(long)(fd / 0x40) + -1] =
       1L << ((byte)((long)fd % 0x40) & 0x3f) | fds.__fds_bits[(long)(fd / 0x40) + -1];
  if ((int)fds.__fds_bits[0xf] == 0) {
    tv.tv_usec = (__suseconds_t)&fdr;
  }
  else {
    fdw = (fd_set *)&fdr;
  }
  iVar1 = select(fds.__fds_bits[0xf]._4_4_ + 1,(fd_set *)fdw,(fd_set *)tv.tv_usec,(fd_set *)0x0,
                 (timeval *)&__i);
  if (iVar1 == -1) {
    perror("select");
  }
  return iVar1;
}

Assistant:

static int socket_wait(int fd, int is_read)
{
	fd_set fds, *fdr = 0, *fdw = 0;
	struct timeval tv;
	int ret;
	tv.tv_sec = 5; tv.tv_usec = 0; // 5 seconds time out
	FD_ZERO(&fds);
	FD_SET(fd, &fds);
	if (is_read) fdr = &fds;
	else fdw = &fds;
	ret = select(fd+1, fdr, fdw, 0, &tv);
#ifndef _WIN32
	if (ret == -1) perror("select");
#else
	if (ret == 0)
		fprintf(stderr, "select time-out\n");
	else if (ret == SOCKET_ERROR)
		fprintf(stderr, "select: %d\n", WSAGetLastError());
#endif
	return ret;
}